

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O3

void destroy_free<cbify>(void *temp)

{
  if (*(void **)((long)temp + 0xb8) != (void *)0x0) {
    operator_delete(*(void **)((long)temp + 0xb8));
  }
  if (*(void **)((long)temp + 0xa0) != (void *)0x0) {
    operator_delete(*(void **)((long)temp + 0xa0));
  }
  if (*(void **)((long)temp + 0x88) != (void *)0x0) {
    operator_delete(*(void **)((long)temp + 0x88));
  }
  if (*(void **)((long)temp + 0x60) != (void *)0x0) {
    operator_delete(*(void **)((long)temp + 0x60));
  }
  free(temp);
  return;
}

Assistant:

void destroy_free(void* temp)
{
  ((T*)temp)->~T();
  free(temp);
}